

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

String * __thiscall Array<String>::append(Array<String> *this,String *value)

{
  String *this_00;
  String *item;
  usize size;
  String *value_local;
  Array<String> *this_local;
  
  reserve(this,((long)(this->_end).item - (long)(this->_begin).item) / 0x28 + 1);
  this_00 = (this->_end).item;
  String::String(this_00,value);
  (this->_end).item = (this->_end).item + 1;
  return this_00;
}

Assistant:

T& append(const T& value)
  {
    usize size = _end.item - _begin.item;
    reserve(size + 1);
    T* item = _end.item;
#ifdef VERIFY
    VERIFY(new(item) T(value) == item);
#else
    new(item) T(value);
#endif
    ++_end.item;
    return *item;
  }